

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

int sexp_buffered_read_char(sexp ctx,sexp p)

{
  sexp psVar1;
  sexp psVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  ssize_t sVar6;
  sexp __n;
  anon_union_24768_35_b8e82fc1_for_value *paVar7;
  sexp psVar8;
  sexp_sint_t n;
  sexp origbytes;
  sexp tmp;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  tmp = (sexp)&DAT_0000043e;
  origbytes = (sexp)&DAT_0000043e;
  psVar8 = (p->value).type.print;
  if (psVar8 < (sexp)(p->value).port.size) {
    (p->value).type.print = (sexp)((long)&psVar8->tag + 1);
    return (uint)*(byte *)((long)&psVar8->tag + (long)&((p->value).type.setters)->tag);
  }
  if ((p->value).flonum_bits[0x28] == '\0') {
    return -1;
  }
  psVar8 = (p->value).type.getters;
  if (psVar8 != (sexp)0x0) {
    sVar5 = fread(&((p->value).type.setters)->markedp,1,0xffc,(FILE *)psVar8);
    uVar4 = (uint)sVar5;
LAB_00110b60:
    uVar3 = uVar4;
    if (-1 < (int)uVar4) {
      (p->value).port.offset = 4;
      *(ulong *)((long)&p->value + 0x48) = (ulong)(uVar4 + 4);
      uVar3 = 0xffffffff;
      if (4 < uVar4 + 4) {
        (p->value).port.offset = 5;
        uVar3 = (uint)(byte)((p->value).type.setters)->markedp;
      }
    }
    return uVar3;
  }
  psVar8 = (p->value).type.slots;
  if ((((ulong)psVar8 & 3) == 0) && (psVar8->tag == 0x12)) {
    sVar6 = read((psVar8->value).promise.donep,&((p->value).type.setters)->markedp,0xffc);
    uVar4 = (uint)sVar6;
    goto LAB_00110b60;
  }
  psVar8 = (p->value).type.cpl;
  if (((ulong)psVar8 & 3) != 0) {
    return -1;
  }
  if (psVar8->tag != 10) {
    return -1;
  }
  if ((psVar8->value).type.name != (sexp)0x6) {
    return -1;
  }
  local_40.var = &tmp;
  local_30.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  local_30.var = &origbytes;
  (ctx->value).context.saves = &local_30;
  psVar8 = (sexp)&DAT_00000009;
  tmp = sexp_list2(ctx,(sexp)&DAT_00000009,(sexp)&DAT_00002001);
  paVar7 = (anon_union_24768_35_b8e82fc1_for_value *)&(((p->value).type.cpl)->value).type.slots;
  if ((p->value).flonum_bits[0x2a] != '\0') {
    paVar7 = &((paVar7->type).name)->value;
  }
  origbytes = (paVar7->type).name;
  tmp = sexp_cons_op(ctx,psVar8,n,origbytes,tmp);
  tmp = sexp_apply(ctx,(((p->value).type.cpl)->value).type.getters,tmp);
  if ((long)tmp < 10 || ((ulong)tmp & 1) == 0) {
    (p->value).port.size = 0;
  }
  else {
    (p->value).port.offset = 4;
    __n = (sexp)((long)tmp >> 1);
    (p->value).port.size = (size_t)__n;
    psVar8 = (sexp)0x4;
    if ((p->value).flonum_bits[0x2a] == '\0') {
      psVar1 = (((p->value).type.cpl)->value).type.slots;
      psVar2 = (psVar1->value).type.name;
      if (origbytes != psVar2) {
        memcpy((p->value).type.setters,
               (void *)((long)&psVar2->value + (long)&((psVar1->value).type.cpl)->value),(size_t)__n
              );
        psVar8 = (p->value).type.print;
        __n = (sexp)(p->value).port.size;
      }
    }
    if (psVar8 < __n) {
      (p->value).type.print = (sexp)((long)&psVar8->tag + 1);
      uVar4 = (uint)*(byte *)((long)&psVar8->tag + (long)&((p->value).type.setters)->tag);
      goto LAB_00110cee;
    }
  }
  uVar4 = 0xffffffff;
LAB_00110cee:
  (ctx->value).context.saves = local_40.next;
  return uVar4;
}

Assistant:

int sexp_buffered_read_char (sexp ctx, sexp p) {
  sexp_gc_var2(tmp, origbytes);
  int res = 0;
  if (sexp_port_offset(p) < sexp_port_size(p)) {
    return ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++];
  } else if (!sexp_port_openp(p)) {
    return EOF;
  } else if (sexp_port_stream(p)) {
    res = fread(sexp_port_buf(p) + BUF_START, 1, SEXP_PORT_BUFFER_SIZE - BUF_START, sexp_port_stream(p));
    if (res >= 0) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = res + BUF_START;
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    }
  } else if (sexp_filenop(sexp_port_fd(p))) {
    res = read(sexp_port_fileno(p), sexp_port_buf(p) + BUF_START, SEXP_PORT_BUFFER_SIZE - BUF_START);
    if (res >= 0) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = res + BUF_START;
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    }
  } else if (sexp_port_customp(p)) {
    sexp_gc_preserve2(ctx, tmp, origbytes);
    tmp = sexp_list2(ctx, sexp_make_fixnum(BUF_START), sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE));
    origbytes = sexp_port_binaryp(p) && !SEXP_USE_PACKED_STRINGS ? sexp_string_bytes(sexp_port_buffer(p)) : sexp_port_buffer(p);
    tmp = sexp_cons(ctx, origbytes, tmp);
    tmp = sexp_apply(ctx, sexp_port_reader(p), tmp);
    if (sexp_fixnump(tmp) && sexp_unbox_fixnum(tmp) > BUF_START) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = sexp_unbox_fixnum(tmp);
      if (!sexp_port_binaryp(p) && !SEXP_USE_PACKED_STRINGS
          && origbytes != sexp_string_bytes(sexp_port_buffer(p))) {
        /* handle resize */
        memcpy(sexp_port_buf(p), sexp_string_data(sexp_port_buffer(p)), sexp_port_size(p));
      }
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    } else {
      res = EOF;
      sexp_port_size(p) = 0;
    }
    sexp_gc_release2(ctx);
  } else {
    res = EOF;
  }
  return res;
}